

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O1

Code * __thiscall
md::Code::or_to_dx(Code *this,Param *param,DataRegister *reg,Size size,bool param_minus_reg)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  uchar local_41;
  uchar local_40;
  undefined7 uStack_3f;
  uchar *local_38;
  long local_30;
  
  uVar5 = 0x40;
  if (size != WORD) {
    uVar5 = (uint)(size == LONG) << 7;
  }
  iVar2 = (**(reg->super_Register).super_Param._vptr_Param)(reg);
  iVar3 = (*param->_vptr_Param[1])(param);
  iVar4 = (**param->_vptr_Param)(param);
  iVar2 = iVar4 + ((uint)param_minus_reg << 8 | iVar2 << 9 | uVar5) + iVar3 * 8 + -0x8000;
  local_40 = (uchar)((uint)iVar2 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  local_40 = (uchar)iVar2;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  (*param->_vptr_Param[2])(&local_40,param);
  puVar6 = (uchar *)CONCAT71(uStack_3f,local_40);
  if (puVar6 != local_38) {
    do {
      local_41 = *puVar6;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_41);
      puVar6 = puVar6 + 1;
    } while (puVar6 != local_38);
  }
  pvVar1 = (void *)CONCAT71(uStack_3f,local_40);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_30 - (long)pvVar1);
  }
  return this;
}

Assistant:

Code& Code::or_to_dx(const Param& param, const DataRegister& reg, Size size, bool param_minus_reg)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t param_minus_reg_mask = ((param_minus_reg) ? 1 : 0) << 8;

    uint16_t opcode = 0x8000 + (reg.getXn() << 9) + param_minus_reg_mask + (size_code << 6) + param.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(param.getAdditionnalData());

    return *this;
}